

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::PatternMatchesString(string *name_str,char *pattern,char *pattern_end)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char *in_RDX;
  char *in_RSI;
  char *name_next;
  char *pattern_next;
  char *name_end;
  char *name_begin;
  char *name;
  char *local_48;
  char *local_40;
  char *local_28;
  char *local_18;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  lVar2 = std::__cxx11::string::size();
  pcVar3 = pcVar1 + lVar2;
  local_48 = pcVar1;
  local_40 = in_RSI;
  local_28 = pcVar1;
  local_18 = in_RSI;
LAB_0011c594:
  do {
    while( true ) {
      if (in_RDX <= local_18 && pcVar3 <= local_28) {
        return true;
      }
      if (local_18 < in_RDX) break;
LAB_0011c68f:
      if ((local_48 <= pcVar1) || (pcVar3 < local_48)) {
        return false;
      }
      local_18 = local_40;
      local_28 = local_48;
    }
    if (*local_18 == '*') {
      local_40 = local_18;
      local_48 = local_28 + 1;
      local_18 = local_18 + 1;
      goto LAB_0011c594;
    }
    if (*local_18 == '?') {
      if (pcVar3 <= local_28) goto LAB_0011c68f;
      local_18 = local_18 + 1;
      local_28 = local_28 + 1;
    }
    else {
      if ((pcVar3 <= local_28) || (*local_28 != *local_18)) goto LAB_0011c68f;
      local_18 = local_18 + 1;
      local_28 = local_28 + 1;
    }
  } while( true );
}

Assistant:

static bool PatternMatchesString(const std::string& name_str,
                                 const char* pattern, const char* pattern_end) {
  const char* name = name_str.c_str();
  const char* const name_begin = name;
  const char* const name_end = name + name_str.size();

  const char* pattern_next = pattern;
  const char* name_next = name;

  while (pattern < pattern_end || name < name_end) {
    if (pattern < pattern_end) {
      switch (*pattern) {
        default:  // Match an ordinary character.
          if (name < name_end && *name == *pattern) {
            ++pattern;
            ++name;
            continue;
          }
          break;
        case '?':  // Match any single character.
          if (name < name_end) {
            ++pattern;
            ++name;
            continue;
          }
          break;
        case '*':
          // Match zero or more characters. Start by skipping over the wildcard
          // and matching zero characters from name. If that fails, restart and
          // match one more character than the last attempt.
          pattern_next = pattern;
          name_next = name + 1;
          ++pattern;
          continue;
      }
    }
    // Failed to match a character. Restart if possible.
    if (name_begin < name_next && name_next <= name_end) {
      pattern = pattern_next;
      name = name_next;
      continue;
    }
    return false;
  }
  return true;
}